

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

RefPtr<wabt::interp::Exception> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::Exception,wabt::interp::Store&,wabt::interp::Ref&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&>
          (RefPtr<wabt::interp::Exception> *__return_storage_ptr__,Store *this,Store *args,
          Ref *args_1,vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *args_2)

{
  Exception *this_00;
  Ref ref;
  Store *store;
  Exception *local_38;
  
  store = this;
  this_00 = (Exception *)operator_new(0x60);
  Exception::Exception(this_00,store,(Ref)args_1->index,args_2);
  local_38 = this_00;
  ref.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Exception*>
                        ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_38);
  RefPtr<wabt::interp::Exception>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Object).self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}